

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O0

int gmath::anon_unknown_0::computeEquidistantDistortion(int n,double *x,int m,double *fvec,void *up)

{
  double *in_RCX;
  double *in_RSI;
  double *in_R8;
  double dVar1;
  double dVar2;
  double dVar3;
  double td;
  double theta8;
  double theta6;
  double theta4;
  double theta2;
  double theta;
  EquidistantDistortionParameter *p;
  
  dVar1 = atan(*in_RSI);
  dVar2 = dVar1 * dVar1;
  dVar3 = dVar2 * dVar2;
  *in_RCX = in_R8[4] -
            dVar1 * (in_R8[3] * dVar3 * dVar3 +
                    in_R8[2] * dVar3 * dVar2 + in_R8[1] * dVar3 + *in_R8 * dVar2 + 1.0);
  return 0;
}

Assistant:

int computeEquidistantDistortion(int n, double x[], int m, double fvec[], void *up)
{
  EquidistantDistortionParameter *p=static_cast<EquidistantDistortionParameter *>(up);

  const double theta=std::atan(x[0]);
  const double theta2=theta*theta;
  const double theta4=theta2*theta2;
  const double theta6=theta4*theta2;
  const double theta8=theta4*theta4;
  const double td=theta*(1+p->ed[0]*theta2+p->ed[1]*theta4+p->ed[2]*theta6+p->ed[3]*theta8);

  fvec[0]=p->radius-td;

  return 0;
}